

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

char * PHYSFS_getWriteDir(void)

{
  char *pcVar1;
  
  __PHYSFS_platformGrabMutex(stateLock);
  if (writeDir == (DirHandle *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = writeDir->dirName;
  }
  __PHYSFS_platformReleaseMutex(stateLock);
  return pcVar1;
}

Assistant:

const char *PHYSFS_getWriteDir(void)
{
    const char *retval = NULL;

    __PHYSFS_platformGrabMutex(stateLock);
    if (writeDir != NULL)
        retval = writeDir->dirName;
    __PHYSFS_platformReleaseMutex(stateLock);

    return retval;
}